

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O1

char * __thiscall cmsys::CommandLineArguments::GetHelp(CommandLineArguments *this,char *arg)

{
  Internal *pIVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  allocator local_51;
  long *local_50 [2];
  long local_40 [2];
  
  pIVar1 = this->Internals;
  std::__cxx11::string::string((string *)local_50,arg,&local_51);
  iVar2 = std::
          _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
          ::find((_Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                  *)&pIVar1->Callbacks,(key_type *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->Internals->Callbacks).
       super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
       ._M_t._M_impl.super__Rb_tree_header) {
    p_Var4 = (_Base_ptr)0x0;
  }
  else {
    do {
      p_Var3 = iVar2._M_node;
      pIVar1 = this->Internals;
      std::__cxx11::string::string((string *)local_50,(char *)p_Var3[3]._M_left,&local_51);
      iVar2 = std::
              _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
              ::find((_Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                      *)&pIVar1->Callbacks,(key_type *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    } while ((_Rb_tree_header *)iVar2._M_node !=
             &(this->Internals->Callbacks).
              super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
              ._M_t._M_impl.super__Rb_tree_header);
    p_Var4 = p_Var3[3]._M_left;
  }
  return (char *)p_Var4;
}

Assistant:

const char* CommandLineArguments::GetHelp(const char* arg)
{
  CommandLineArguments::Internal::CallbacksMap::iterator it 
    = this->Internals->Callbacks.find(arg);
  if ( it == this->Internals->Callbacks.end() )
    {
    return 0;
    }

  // Since several arguments may point to the same argument, find the one this
  // one point to if this one is pointing to another argument.
  CommandLineArgumentsCallbackStructure *cs = &(it->second);
  for(;;)
    {
    CommandLineArguments::Internal::CallbacksMap::iterator hit 
      = this->Internals->Callbacks.find(cs->Help);
    if ( hit == this->Internals->Callbacks.end() )
      {
      break;
      }
    cs = &(hit->second);
    }
  return cs->Help;
}